

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O0

int lws_change_pollfd(lws *wsi,int _and,int _or)

{
  int iVar1;
  int ret;
  lws_context_per_thread *pt;
  int _or_local;
  int _and_local;
  lws *wsi_local;
  
  iVar1 = __lws_change_pollfd(wsi,_and,_or);
  return iVar1;
}

Assistant:

int
lws_change_pollfd(struct lws *wsi, int _and, int _or)
{
	struct lws_context_per_thread *pt;
	int ret = 0;

	pt = &wsi->a.context->pt[(int)wsi->tsi];

	lws_pt_lock(pt, __func__);
	ret = __lws_change_pollfd(wsi, _and, _or);
	lws_pt_unlock(pt);

	return ret;
}